

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_home(REF_SEARCH ref_search,REF_INT child,REF_INT parent)

{
  uint uVar1;
  double local_58;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL right_distance;
  REF_DBL left_distance;
  REF_DBL child_distance;
  REF_INT parent_local;
  REF_INT child_local;
  REF_SEARCH ref_search_local;
  
  child_distance._0_4_ = parent;
  child_distance._4_4_ = child;
  _parent_local = ref_search;
  if (child == -1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x51,
           "ref_search_home","empty child");
    ref_search_local._4_4_ = 1;
  }
  else if (parent == -1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x52,
           "ref_search_home","empty parent");
    ref_search_local._4_4_ = 1;
  }
  else if (child == parent) {
    ref_search_local._4_4_ = 0;
  }
  else {
    uVar1 = ref_search_distance(ref_search,child,parent,&left_distance);
    if (uVar1 == 0) {
      if (_parent_local->children_ball[child_distance._0_4_] <=
          left_distance + _parent_local->radius[child_distance._4_4_]) {
        local_58 = left_distance + _parent_local->radius[child_distance._4_4_];
      }
      else {
        local_58 = _parent_local->children_ball[child_distance._0_4_];
      }
      _parent_local->children_ball[child_distance._0_4_] = local_58;
      if (_parent_local->left[child_distance._0_4_] == -1) {
        _parent_local->left[child_distance._0_4_] = child_distance._4_4_;
        ref_search_local._4_4_ = 0;
      }
      else if (_parent_local->right[child_distance._0_4_] == -1) {
        _parent_local->right[child_distance._0_4_] = child_distance._4_4_;
        ref_search_local._4_4_ = 0;
      }
      else {
        uVar1 = ref_search_distance(_parent_local,child_distance._4_4_,
                                    _parent_local->left[child_distance._0_4_],&right_distance);
        if (uVar1 == 0) {
          uVar1 = ref_search_distance(_parent_local,child_distance._4_4_,
                                      _parent_local->right[child_distance._0_4_],
                                      (REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 == 0) {
            if (_ref_private_macro_code_rss_1 <= right_distance) {
              uVar1 = ref_search_home(_parent_local,child_distance._4_4_,
                                      _parent_local->right[child_distance._0_4_]);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                       ,0x72,"ref_search_home",(ulong)uVar1,"recursively add to right child");
                return uVar1;
              }
            }
            else {
              uVar1 = ref_search_home(_parent_local,child_distance._4_4_,
                                      _parent_local->left[child_distance._0_4_]);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                       ,0x6f,"ref_search_home",(ulong)uVar1,"recursively add to left child");
                return uVar1;
              }
            }
            ref_search_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                   ,0x6b,"ref_search_home",(ulong)uVar1,"right dist");
            ref_search_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x68,"ref_search_home",(ulong)uVar1,"left dist");
          ref_search_local._4_4_ = uVar1;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x57
             ,"ref_search_home",(ulong)uVar1,"d");
      ref_search_local._4_4_ = uVar1;
    }
  }
  return ref_search_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_search_home(REF_SEARCH ref_search, REF_INT child,
                                          REF_INT parent) {
  REF_DBL child_distance;
  REF_DBL left_distance, right_distance;

  RUS(REF_EMPTY, child, "empty child");
  RUS(REF_EMPTY, parent, "empty parent");

  /* done, don't add self to children */
  if (child == parent) return REF_SUCCESS;

  RSS(ref_search_distance(ref_search, child, parent, &child_distance), "d");
  ref_search->children_ball[parent] =
      MAX(ref_search->children_ball[parent],
          child_distance + ref_search->radius[child]);

  if (REF_EMPTY == ref_search->left[parent]) {
    ref_search->left[parent] = child;
    return REF_SUCCESS;
  }

  if (REF_EMPTY == ref_search->right[parent]) {
    ref_search->right[parent] = child;
    return REF_SUCCESS;
  }

  RSS(ref_search_distance(ref_search, child, ref_search->left[parent],
                          &left_distance),
      "left dist");
  RSS(ref_search_distance(ref_search, child, ref_search->right[parent],
                          &right_distance),
      "right dist");

  if (left_distance < right_distance) {
    RSS(ref_search_home(ref_search, child, ref_search->left[parent]),
        "recursively add to left child");
  } else {
    RSS(ref_search_home(ref_search, child, ref_search->right[parent]),
        "recursively add to right child");
  }

  return REF_SUCCESS;
}